

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  undefined1 *puVar1;
  Verbosity VVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  double dVar5;
  Settings *pSVar6;
  Verbosity old_verbosity;
  Real RVar7;
  
  Statistics::clearSolvingData(this->_statistics);
  this->_status = UNKNOWN;
  puVar1 = &(this->_solReal).field_0xe0;
  *puVar1 = *puVar1 & 0xf0;
  this->_hasSolReal = false;
  this->_hasSolRational = false;
  puVar1 = &(this->_solRational).field_0xd0;
  *puVar1 = *puVar1 & 0xf0;
  pSVar6 = this->_currentSettings;
  if ((pSVar6->_intParamValues[0x11] == 0) ||
     (((pSVar6->_intParamValues[0x11] == 1 && (1e-09 <= pSVar6->_realParamValues[0])) &&
      (1e-09 <= pSVar6->_realParamValues[1])))) {
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
        pSVar6 = this->_currentSettings;
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointFeastol(pTVar3,pSVar6->_realParamValues[0]);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointOpttol(pTVar3,this->_currentSettings->_realParamValues[1]);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar7 = Tolerances::floatingPointFeastol(pTVar3);
    dVar5 = DAT_006adeb0;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (RVar7 < dVar5) {
      VVar2 = (this->spxout).m_verbosity;
      if (0 < (int)VVar2) {
        (this->spxout).m_verbosity = WARNING;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[1],
                   "Cannot call floating-point solver with feasibility tolerance below ",0x43);
        std::ostream::_M_insert<double>(DAT_006adeb0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity]," - relaxing tolerance\n",
                   0x16);
        (this->spxout).m_verbosity = VVar2;
      }
      Tolerances::setFloatingPointFeastol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 DAT_006adeb0);
    }
    pTVar3 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    RVar7 = Tolerances::floatingPointOpttol(pTVar3);
    dVar5 = DAT_006adeb8;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (RVar7 < dVar5) {
      VVar2 = (this->spxout).m_verbosity;
      if (0 < (int)VVar2) {
        (this->spxout).m_verbosity = WARNING;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[1],
                   "Cannot call floating-point solver with optimality tolerance below ",0x42);
        std::ostream::_M_insert<double>(DAT_006adeb8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity]," - relaxing tolerance\n",
                   0x16);
        (this->spxout).m_verbosity = VVar2;
      }
      Tolerances::setFloatingPointOpttol
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 DAT_006adeb8);
    }
    (this->_solver).solvingForBoosted = false;
    _optimize(this,interrupt);
  }
  else {
    if ((pSVar6->_intParamValues[0xf] != 2) && (pSVar6->_intParamValues[0xf] == 0)) {
      _syncLPRational(this,true);
    }
    _optimizeRational(this,interrupt);
  }
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((this->spxout).m_streams[3],"\n",1);
    printShortStatistics(this,(this->spxout).m_streams[3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
    (this->spxout).m_verbosity = VVar2;
  }
  return this->_status;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::optimize(volatile bool* interrupt)
{
   assert(_isConsistent());

   // clear statistics
   _statistics->clearSolvingData();

   // the solution is no longer valid
   _invalidateSolution();

   // decide whether to solve the rational LP with iterative refinement or call the standard floating-point solver
   if(intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_REAL
         || (intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_AUTO
             && realParam(SoPlexBase<R>::FEASTOL) >= 1e-9 && realParam(SoPlexBase<R>::OPTTOL) >= 1e-9))
   {
      // the only tolerances used are the ones for the floating-point solver, so set them to the global tolerances
      this->tolerances()->setFloatingPointFeastol(realParam(SoPlexBase<R>::FEASTOL));
      this->tolerances()->setFloatingPointOpttol(realParam(SoPlexBase<R>::OPTTOL));

      // ensure that tolerances are reasonable for the floating-point solver
      // todo: refactor to take into account epsilon value instead
      if(this->tolerances()->floatingPointFeastol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with feasibility tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointFeastol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL]);
      }

      if(this->tolerances()->floatingPointOpttol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with optimality tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointOpttol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL]);
      }

      _solver.setSolvingForBoosted(false);

      _optimize(interrupt);
#ifdef SOPLEX_DEBUG // this check will remove scaling of the realLP
      _checkBasisScaling();
#endif
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_ONLYREAL)
   {
      _syncLPRational();
      _optimizeRational(interrupt);
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);

#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif
   }
   else
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);
   }

   SPX_MSG_INFO1(spxout, spxout << "\n";
                 printShortStatistics(spxout.getStream(SPxOut::INFO1));
                 spxout << "\n");


   return status();
}